

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Emu.cpp
# Opt level: O3

blargg_err_t parse_header(byte_ *in,long size,file_t *out)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  
  out->header = (header_t *)in;
  out->end = in + size;
  if ((0x13 < size) && (*(long *)in == 0x4c554d455941585a)) {
    uVar1 = (uint)in[0x13] << 0x10 | (uint)in[0x12] << 0x18;
    if ((uVar1 == 0) ||
       (iVar2 = (int)uVar1 >> 0x10, ((int)size + (uint)in[0x10] * -4) - 4 < iVar2 + 0x12U)) {
      pbVar4 = (byte *)0x0;
    }
    else {
      pbVar4 = in + (long)iVar2 + 0x12;
    }
    out->tracks = pbVar4;
    pcVar3 = (blargg_err_t)0x0;
    if (pbVar4 == (byte *)0x0) {
      pcVar3 = "Missing track data";
    }
    return pcVar3;
  }
  return "Wrong file type for this emulator";
}

Assistant:

static blargg_err_t parse_header( byte const* in, long size, Ay_Emu::file_t* out )
{
	typedef Ay_Emu::header_t header_t;
	out->header = (header_t const*) in;
	out->end    = in + size;
	
	if ( size < Ay_Emu::header_size )
		return gme_wrong_file_type;
	
	header_t const& h = *(header_t const*) in;
	if ( memcmp( h.tag, "ZXAYEMUL", 8 ) )
		return gme_wrong_file_type;
	
	out->tracks = get_data( *out, h.track_info, (h.max_track + 1) * 4 );
	if ( !out->tracks )
		return "Missing track data";
	
	return 0;
}